

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O2

ByteArray *
ot::commissioner::CommissionerApp::GetSteeringData
          (CommissionerDataset *aDataset,JoinerType aJoinerType)

{
  if (aJoinerType < (kNMKP|kAE)) {
    aDataset->mPresentFlags =
         aDataset->mPresentFlags | (ushort)(0x80010002000 >> ((byte)(aJoinerType << 4) & 0x3f));
    return (ByteArray *)
           ((long)&(aDataset->mSteeringData).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start + (ulong)(aJoinerType * 0x18));
  }
  abort();
}

Assistant:

ByteArray &CommissionerApp::GetSteeringData(CommissionerDataset &aDataset, JoinerType aJoinerType)
{
    switch (aJoinerType)
    {
    case JoinerType::kMeshCoP:
        aDataset.mPresentFlags |= CommissionerDataset::kSteeringDataBit;
        return aDataset.mSteeringData;

    case JoinerType::kAE:
        aDataset.mPresentFlags |= CommissionerDataset::kAeSteeringDataBit;
        return aDataset.mAeSteeringData;

    case JoinerType::kNMKP:
        aDataset.mPresentFlags |= CommissionerDataset::kNmkpSteeringDataBit;
        return aDataset.mNmkpSteeringData;

    default:
        VerifyOrDie(false);
        aDataset.mPresentFlags |= CommissionerDataset::kSteeringDataBit;
        return aDataset.mSteeringData;
    }
}